

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<4,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *this;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  byte bVar20;
  bool bVar21;
  bool bVar22;
  uint uVar23;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong *puVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  long local_fb0;
  ulong local_fa8;
  long local_fa0;
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  ulong local_f78;
  undefined4 uStack_f70;
  ulong local_f68 [487];
  ulong uVar24;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  
  local_f78 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  fVar2 = (context->query_radius).field_0.m128[0];
  auVar52 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_fd8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar4 = (context->query_radius).field_0;
    local_fd8 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  }
  uVar3 = *(undefined4 *)&(query->p).field_0;
  local_fe8._4_4_ = uVar3;
  local_fe8._0_4_ = uVar3;
  local_fe8._8_4_ = uVar3;
  local_fe8._12_4_ = uVar3;
  auVar57 = ZEXT1664(local_fe8);
  uVar3 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  auVar55._4_4_ = uVar3;
  auVar55._0_4_ = uVar3;
  auVar55._8_4_ = uVar3;
  auVar55._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  auVar54._4_4_ = uVar3;
  auVar54._0_4_ = uVar3;
  auVar54._8_4_ = uVar3;
  auVar54._12_4_ = uVar3;
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
  auVar58 = ZEXT1664(auVar31);
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
  auVar59 = ZEXT1664(auVar31);
  puVar29 = local_f68;
  fVar2 = fVar2 * fVar2;
  auVar31._4_4_ = fVar2;
  auVar31._0_4_ = fVar2;
  auVar31._8_4_ = fVar2;
  auVar31._12_4_ = fVar2;
  bVar22 = false;
LAB_01eaa60f:
  local_fc8 = auVar52._0_16_;
  auVar12 = vsubps_avx(auVar57._0_16_,local_fc8);
  auVar51._0_4_ = auVar57._0_4_ + auVar52._0_4_;
  auVar51._4_4_ = auVar57._4_4_ + auVar52._4_4_;
  auVar51._8_4_ = auVar57._8_4_ + auVar52._8_4_;
  auVar51._12_4_ = auVar57._12_4_ + auVar52._12_4_;
  local_f88 = auVar58._0_16_;
  auVar32 = vsubps_avx512vl(auVar55,local_f88);
  auVar33 = vaddps_avx512vl(auVar55,local_f88);
  local_f98 = auVar59._0_16_;
  auVar34 = vsubps_avx512vl(auVar54,local_f98);
  auVar35 = vaddps_avx512vl(auVar54,local_f98);
  while( true ) {
    pfVar1 = (float *)(puVar29 + -1);
    puVar29 = puVar29 + -2;
    if ((float)local_fd8._0_4_ < *pfVar1) break;
    uVar30 = *puVar29;
LAB_01eaa64f:
    auVar40 = auVar57._0_16_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar30 & 8) != 0) {
LAB_01eaa9d2:
        local_fb0 = (ulong)((uint)uVar30 & 0xf) - 8;
        if (local_fb0 == 0) break;
        lVar27 = (uVar30 & 0xfffffffffffffff0) + 0xd0;
        local_fa0 = 0;
        uVar30 = 0;
        goto LAB_01eaaa05;
      }
      auVar38 = vmaxps_avx(auVar40,*(undefined1 (*) [16])(uVar30 + 0x20));
      auVar47 = vminps_avx(auVar38,*(undefined1 (*) [16])(uVar30 + 0x30));
      auVar38 = vmaxps_avx(auVar55,*(undefined1 (*) [16])(uVar30 + 0x40));
      auVar47 = vsubps_avx(auVar47,auVar40);
      auVar40 = vminps_avx(auVar38,*(undefined1 (*) [16])(uVar30 + 0x50));
      auVar38 = vsubps_avx(auVar40,auVar55);
      auVar40 = vmaxps_avx(auVar54,*(undefined1 (*) [16])(uVar30 + 0x60));
      auVar40 = vminps_avx(auVar40,*(undefined1 (*) [16])(uVar30 + 0x70));
      auVar40 = vsubps_avx(auVar40,auVar54);
      local_ff8._0_4_ =
           auVar47._0_4_ * auVar47._0_4_ + auVar38._0_4_ * auVar38._0_4_ +
           auVar40._0_4_ * auVar40._0_4_;
      local_ff8._4_4_ =
           auVar47._4_4_ * auVar47._4_4_ + auVar38._4_4_ * auVar38._4_4_ +
           auVar40._4_4_ * auVar40._4_4_;
      fStack_ff0 = auVar47._8_4_ * auVar47._8_4_ + auVar38._8_4_ * auVar38._8_4_ +
                   auVar40._8_4_ * auVar40._8_4_;
      fStack_fec = auVar47._12_4_ * auVar47._12_4_ + auVar38._12_4_ * auVar38._12_4_ +
                   auVar40._12_4_ * auVar40._12_4_;
      uVar13 = vcmpps_avx512vl(_local_ff8,auVar31,2);
      uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x20),
                               *(undefined1 (*) [16])(uVar30 + 0x30),2);
      bVar20 = (byte)uVar13 & (byte)uVar14;
    }
    else {
      if ((uVar30 & 8) != 0) goto LAB_01eaa9d2;
      auVar38 = *(undefined1 (*) [16])(uVar30 + 0x20);
      auVar47 = *(undefined1 (*) [16])(uVar30 + 0x30);
      auVar36 = vmaxps_avx(auVar40,auVar38);
      auVar36 = vminps_avx(auVar36,auVar47);
      auVar36 = vsubps_avx(auVar36,auVar40);
      auVar40 = vmaxps_avx(auVar55,*(undefined1 (*) [16])(uVar30 + 0x40));
      auVar40 = vminps_avx(auVar40,*(undefined1 (*) [16])(uVar30 + 0x50));
      auVar44 = vsubps_avx(auVar40,auVar55);
      auVar40 = vmaxps_avx(auVar54,*(undefined1 (*) [16])(uVar30 + 0x60));
      auVar40 = vminps_avx(auVar40,*(undefined1 (*) [16])(uVar30 + 0x70));
      auVar40 = vsubps_avx(auVar40,auVar54);
      auVar57 = ZEXT1664(local_fe8);
      local_ff8._4_4_ =
           auVar36._4_4_ * auVar36._4_4_ + auVar44._4_4_ * auVar44._4_4_ +
           auVar40._4_4_ * auVar40._4_4_;
      local_ff8._0_4_ =
           auVar36._0_4_ * auVar36._0_4_ + auVar44._0_4_ * auVar44._0_4_ +
           auVar40._0_4_ * auVar40._0_4_;
      fStack_ff0 = auVar36._8_4_ * auVar36._8_4_ + auVar44._8_4_ * auVar44._8_4_ +
                   auVar40._8_4_ * auVar40._8_4_;
      fStack_fec = auVar36._12_4_ * auVar36._12_4_ + auVar44._12_4_ * auVar44._12_4_ +
                   auVar40._12_4_ * auVar40._12_4_;
      uVar13 = vcmpps_avx512vl(auVar38,auVar47,2);
      uVar14 = vcmpps_avx512vl(auVar47,auVar12,1);
      uVar15 = vcmpps_avx512vl(auVar38,auVar51,6);
      uVar16 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x50),auVar32,1);
      uVar17 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x40),auVar33,6);
      uVar18 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x70),auVar34,1);
      uVar19 = vcmpps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x60),auVar35,6);
      bVar20 = ~((byte)uVar17 | (byte)uVar15 | (byte)uVar19 | (byte)uVar14 | (byte)uVar16 |
                (byte)uVar18) & (byte)uVar13;
    }
    if (bVar20 != 0) {
      uVar26 = uVar30 & 0xfffffffffffffff0;
      lVar27 = 0;
      for (uVar30 = (ulong)bVar20; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar30 = *(ulong *)(uVar26 + lVar27 * 8);
      uVar23 = bVar20 - 1 & (uint)bVar20;
      uVar24 = (ulong)uVar23;
      if (uVar23 != 0) {
        uVar5 = *(uint *)(local_ff8 + lVar27 * 4);
        lVar27 = 0;
        for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        uVar23 = uVar23 - 1 & uVar23;
        uVar25 = (ulong)uVar23;
        uVar24 = *(ulong *)(uVar26 + lVar27 * 8);
        uVar6 = *(uint *)(local_ff8 + lVar27 * 4);
        if (uVar23 == 0) {
          if (uVar5 < uVar6) {
            *puVar29 = uVar24;
            *(uint *)(puVar29 + 1) = uVar6;
            puVar29 = puVar29 + 2;
          }
          else {
            *puVar29 = uVar30;
            *(uint *)(puVar29 + 1) = uVar5;
            uVar30 = uVar24;
            puVar29 = puVar29 + 2;
          }
        }
        else {
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar30;
          auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar5));
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar24;
          auVar38 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar6));
          lVar27 = 0;
          for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar23 = uVar23 - 1 & uVar23;
          uVar30 = (ulong)uVar23;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)(uVar26 + lVar27 * 8);
          auVar46 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_ff8 + lVar27 * 4)));
          auVar47 = vpshufd_avx(auVar40,0xaa);
          auVar36 = vpshufd_avx(auVar38,0xaa);
          auVar44 = vpshufd_avx(auVar46,0xaa);
          if (uVar23 == 0) {
            uVar30 = vpcmpgtd_avx512vl(auVar36,auVar47);
            uVar30 = uVar30 & 0xf;
            auVar36 = vpblendmd_avx512vl(auVar38,auVar40);
            bVar21 = (bool)((byte)uVar30 & 1);
            auVar37._0_4_ = (uint)bVar21 * auVar36._0_4_ | (uint)!bVar21 * auVar47._0_4_;
            bVar21 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar37._4_4_ = (uint)bVar21 * auVar36._4_4_ | (uint)!bVar21 * auVar47._4_4_;
            bVar21 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar37._8_4_ = (uint)bVar21 * auVar36._8_4_ | (uint)!bVar21 * auVar47._8_4_;
            bVar21 = SUB81(uVar30 >> 3,0);
            auVar37._12_4_ = (uint)bVar21 * auVar36._12_4_ | (uint)!bVar21 * auVar47._12_4_;
            auVar38 = vmovdqa32_avx512vl(auVar38);
            bVar21 = (bool)((byte)uVar30 & 1);
            auVar39._0_4_ = (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * auVar40._0_4_;
            bVar21 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar39._4_4_ = (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * auVar40._4_4_;
            bVar21 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar39._8_4_ = (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * auVar40._8_4_;
            bVar21 = SUB81(uVar30 >> 3,0);
            auVar39._12_4_ = (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * auVar40._12_4_;
            auVar40 = vpshufd_avx(auVar37,0xaa);
            uVar26 = vpcmpgtd_avx512vl(auVar44,auVar40);
            uVar26 = uVar26 & 0xf;
            auVar38 = vpblendmd_avx512vl(auVar46,auVar37);
            bVar21 = (bool)((byte)uVar26 & 1);
            bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
            uVar30 = CONCAT44((uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * auVar40._4_4_,
                              (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * auVar40._0_4_);
            auVar40 = vmovdqa32_avx512vl(auVar46);
            bVar21 = (bool)((byte)uVar26 & 1);
            auVar41._0_4_ = (uint)bVar21 * auVar40._0_4_ | !bVar21 * auVar37._0_4_;
            bVar21 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar41._4_4_ = (uint)bVar21 * auVar40._4_4_ | !bVar21 * auVar37._4_4_;
            bVar21 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar41._8_4_ = (uint)bVar21 * auVar40._8_4_ | !bVar21 * auVar37._8_4_;
            bVar21 = SUB81(uVar26 >> 3,0);
            auVar41._12_4_ = (uint)bVar21 * auVar40._12_4_ | !bVar21 * auVar37._12_4_;
            auVar40 = vpshufd_avx(auVar41,0xaa);
            auVar38 = vpshufd_avx(auVar39,0xaa);
            uVar26 = vpcmpgtd_avx512vl(auVar40,auVar38);
            uVar26 = uVar26 & 0xf;
            auVar38 = vpblendmd_avx512vl(auVar41,auVar39);
            bVar21 = (bool)((byte)uVar26 & 1);
            auVar42._0_4_ = (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * auVar40._0_4_;
            bVar21 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar42._4_4_ = (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * auVar40._4_4_;
            bVar21 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar42._8_4_ = (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * auVar40._8_4_;
            bVar21 = SUB81(uVar26 >> 3,0);
            auVar42._12_4_ = (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * auVar40._12_4_;
            auVar40 = vmovdqa32_avx512vl(auVar41);
            bVar21 = (bool)((byte)uVar26 & 1);
            bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
            bVar10 = SUB81(uVar26 >> 3,0);
            *(uint *)puVar29 = (uint)bVar21 * auVar40._0_4_ | !bVar21 * auVar39._0_4_;
            *(uint *)((long)puVar29 + 4) = (uint)bVar7 * auVar40._4_4_ | !bVar7 * auVar39._4_4_;
            *(uint *)(puVar29 + 1) = (uint)bVar8 * auVar40._8_4_ | !bVar8 * auVar39._8_4_;
            *(uint *)((long)puVar29 + 0xc) =
                 (uint)bVar10 * auVar40._12_4_ | !bVar10 * auVar39._12_4_;
            *(undefined1 (*) [16])(puVar29 + 2) = auVar42;
            puVar29 = puVar29 + 4;
          }
          else {
            lVar27 = 0;
            for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              lVar27 = lVar27 + 1;
            }
            uVar23 = *(uint *)(local_ff8 + lVar27 * 4);
            auVar56._8_8_ = 0;
            auVar56._0_8_ = *(ulong *)(uVar26 + lVar27 * 8);
            auVar45 = vpunpcklqdq_avx(auVar56,ZEXT416(uVar23));
            uVar30 = vpcmpgtd_avx512vl(auVar36,auVar47);
            uVar30 = uVar30 & 0xf;
            auVar36 = vpblendmd_avx512vl(auVar38,auVar40);
            bVar21 = (bool)((byte)uVar30 & 1);
            auVar43._0_4_ = (uint)bVar21 * auVar36._0_4_ | (uint)!bVar21 * auVar47._0_4_;
            bVar21 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar43._4_4_ = (uint)bVar21 * auVar36._4_4_ | (uint)!bVar21 * auVar47._4_4_;
            bVar21 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar43._8_4_ = (uint)bVar21 * auVar36._8_4_ | (uint)!bVar21 * auVar47._8_4_;
            bVar21 = SUB81(uVar30 >> 3,0);
            auVar43._12_4_ = (uint)bVar21 * auVar36._12_4_ | (uint)!bVar21 * auVar47._12_4_;
            auVar38 = vmovdqa32_avx512vl(auVar38);
            bVar21 = (bool)((byte)uVar30 & 1);
            auVar36._0_4_ = (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * auVar40._0_4_;
            bVar21 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar36._4_4_ = (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * auVar40._4_4_;
            bVar21 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar36._8_4_ = (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * auVar40._8_4_;
            bVar21 = SUB81(uVar30 >> 3,0);
            auVar36._12_4_ = (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * auVar40._12_4_;
            auVar53._4_4_ = uVar23;
            auVar53._0_4_ = uVar23;
            auVar53._8_4_ = uVar23;
            auVar53._12_4_ = uVar23;
            auVar57 = ZEXT1664(local_fe8);
            uVar30 = vpcmpgtd_avx512vl(auVar53,auVar44);
            uVar30 = uVar30 & 0xf;
            auVar40 = vpblendmd_avx512vl(auVar45,auVar46);
            bVar21 = (bool)((byte)uVar30 & 1);
            auVar44._0_4_ = (uint)bVar21 * auVar40._0_4_ | !bVar21 * uVar23;
            bVar21 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar44._4_4_ = (uint)bVar21 * auVar40._4_4_ | !bVar21 * uVar23;
            bVar21 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar44._8_4_ = (uint)bVar21 * auVar40._8_4_ | !bVar21 * uVar23;
            bVar21 = SUB81(uVar30 >> 3,0);
            auVar44._12_4_ = (uint)bVar21 * auVar40._12_4_ | !bVar21 * uVar23;
            auVar40 = vmovdqa32_avx512vl(auVar45);
            bVar21 = (bool)((byte)uVar30 & 1);
            auVar45._0_4_ = (uint)bVar21 * auVar40._0_4_ | (uint)!bVar21 * auVar46._0_4_;
            bVar21 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar21 * auVar40._4_4_ | (uint)!bVar21 * auVar46._4_4_;
            bVar21 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar21 * auVar40._8_4_ | (uint)!bVar21 * auVar46._8_4_;
            bVar21 = SUB81(uVar30 >> 3,0);
            auVar45._12_4_ = (uint)bVar21 * auVar40._12_4_ | (uint)!bVar21 * auVar46._12_4_;
            auVar40 = vpshufd_avx(auVar45,0xaa);
            auVar38 = vpshufd_avx(auVar36,0xaa);
            uVar30 = vpcmpgtd_avx512vl(auVar40,auVar38);
            uVar30 = uVar30 & 0xf;
            auVar38 = vpblendmd_avx512vl(auVar45,auVar36);
            bVar21 = (bool)((byte)uVar30 & 1);
            auVar46._0_4_ = (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * auVar40._0_4_;
            bVar21 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * auVar40._4_4_;
            bVar21 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * auVar40._8_4_;
            bVar21 = SUB81(uVar30 >> 3,0);
            auVar46._12_4_ = (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * auVar40._12_4_;
            auVar47 = vmovdqa32_avx512vl(auVar45);
            bVar21 = (bool)((byte)uVar30 & 1);
            bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
            bVar11 = SUB81(uVar30 >> 3,0);
            auVar40 = vpshufd_avx(auVar44,0xaa);
            auVar38 = vpshufd_avx(auVar43,0xaa);
            uVar26 = vpcmpgtd_avx512vl(auVar40,auVar38);
            uVar26 = uVar26 & 0xf;
            auVar38 = vpblendmd_avx512vl(auVar44,auVar43);
            bVar7 = (bool)((byte)uVar26 & 1);
            bVar10 = (bool)((byte)(uVar26 >> 1) & 1);
            uVar30 = CONCAT44((uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * auVar40._4_4_,
                              (uint)bVar7 * auVar38._0_4_ | (uint)!bVar7 * auVar40._0_4_);
            auVar40 = vmovdqa32_avx512vl(auVar44);
            bVar7 = (bool)((byte)uVar26 & 1);
            auVar48._0_4_ = (uint)bVar7 * auVar40._0_4_ | !bVar7 * auVar43._0_4_;
            bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar7 * auVar40._4_4_ | !bVar7 * auVar43._4_4_;
            bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar7 * auVar40._8_4_ | !bVar7 * auVar43._8_4_;
            bVar7 = SUB81(uVar26 >> 3,0);
            auVar48._12_4_ = (uint)bVar7 * auVar40._12_4_ | !bVar7 * auVar43._12_4_;
            auVar40 = vpshufd_avx(auVar48,0xaa);
            auVar38 = vpshufd_avx(auVar46,0xaa);
            uVar26 = vpcmpgtd_avx512vl(auVar38,auVar40);
            uVar26 = uVar26 & 0xf;
            auVar38 = vpblendmd_avx512vl(auVar46,auVar48);
            bVar7 = (bool)((byte)uVar26 & 1);
            auVar49._0_4_ = (uint)bVar7 * auVar38._0_4_ | (uint)!bVar7 * auVar40._0_4_;
            bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * auVar40._4_4_;
            bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * auVar40._8_4_;
            bVar7 = SUB81(uVar26 >> 3,0);
            auVar49._12_4_ = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * auVar40._12_4_;
            auVar40 = vmovdqa32_avx512vl(auVar46);
            bVar7 = (bool)((byte)uVar26 & 1);
            auVar50._0_4_ = (uint)bVar7 * auVar40._0_4_ | !bVar7 * auVar48._0_4_;
            bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar7 * auVar40._4_4_ | !bVar7 * auVar48._4_4_;
            bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar7 * auVar40._8_4_ | !bVar7 * auVar48._8_4_;
            bVar7 = SUB81(uVar26 >> 3,0);
            auVar50._12_4_ = (uint)bVar7 * auVar40._12_4_ | !bVar7 * auVar48._12_4_;
            *(uint *)puVar29 = (uint)bVar21 * auVar47._0_4_ | !bVar21 * auVar36._0_4_;
            *(uint *)((long)puVar29 + 4) = (uint)bVar8 * auVar47._4_4_ | !bVar8 * auVar36._4_4_;
            *(uint *)(puVar29 + 1) = (uint)bVar9 * auVar47._8_4_ | !bVar9 * auVar36._8_4_;
            *(uint *)((long)puVar29 + 0xc) =
                 (uint)bVar11 * auVar47._12_4_ | !bVar11 * auVar36._12_4_;
            *(undefined1 (*) [16])(puVar29 + 2) = auVar50;
            *(undefined1 (*) [16])(puVar29 + 4) = auVar49;
            puVar29 = puVar29 + 6;
          }
        }
      }
      goto LAB_01eaa64f;
    }
    if (puVar29 == &local_f78) {
      return bVar22;
    }
  }
  auVar52 = ZEXT1664(local_fc8);
  goto LAB_01eaab15;
LAB_01eaaa05:
  do {
    local_fa8 = uVar30;
    lVar28 = -0x10;
    bVar20 = 0;
    do {
      uVar23 = *(uint *)(lVar27 + lVar28);
      if ((ulong)uVar23 == 0xffffffff) break;
      this = (context->scene->geometries).items[uVar23].ptr;
      context->geomID = uVar23;
      context->primID = *(uint *)(lVar27 + 0x10 + lVar28);
      bVar21 = Geometry::pointQuery(this,query,context);
      bVar20 = bVar20 | bVar21;
      lVar28 = lVar28 + 4;
    } while (lVar28 != 0);
    uVar30 = CONCAT71((int7)(local_fa8 >> 8),(byte)local_fa8 | bVar20);
    local_fa0 = local_fa0 + 1;
    lVar27 = lVar27 + 0xe0;
  } while (local_fa0 != local_fb0);
  if ((local_fa8 & 1) == 0 && bVar20 == 0) {
    auVar52 = ZEXT1664(local_fc8);
    auVar57 = ZEXT1664(local_fe8);
    auVar58 = ZEXT1664(local_f88);
    auVar59 = ZEXT1664(local_f98);
  }
  else {
    uVar3 = *(undefined4 *)&(context->query_radius).field_0;
    auVar52 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
    auVar58 = ZEXT1664(auVar31);
    auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
    auVar59 = ZEXT1664(auVar31);
    auVar57 = ZEXT1664(local_fe8);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_fd8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar4 = (context->query_radius).field_0;
      local_fd8 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    }
    bVar22 = true;
  }
LAB_01eaab15:
  auVar31._0_4_ = auVar52._0_4_ * auVar52._0_4_;
  auVar31._4_4_ = auVar52._4_4_ * auVar52._4_4_;
  auVar31._8_4_ = auVar52._8_4_ * auVar52._8_4_;
  auVar31._12_4_ = auVar52._12_4_ * auVar52._12_4_;
  if (puVar29 == &local_f78) {
    return bVar22;
  }
  goto LAB_01eaa60f;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }